

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode http_perhapsrewind(Curl_easy *data,connectdata *conn)

{
  byte bVar1;
  HTTP *pHVar2;
  long lVar3;
  unsigned_long uVar4;
  uint uVar5;
  CURLcode CVar6;
  curl_off_t *pcVar7;
  long lVar8;
  
  pHVar2 = (data->req).p.http;
  if (pHVar2 == (HTTP *)0x0) {
    return CURLE_OK;
  }
  bVar1 = (data->state).httpreq;
  if (bVar1 == 0) {
    return CURLE_OK;
  }
  if (bVar1 == 5) {
    return CURLE_OK;
  }
  lVar3 = (data->req).writebytecount;
  uVar5 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar5 & 0x14000) == 0x4000) {
    if (bVar1 - 2 < 2) {
      pcVar7 = &pHVar2->postsize;
LAB_00136e93:
      lVar8 = *pcVar7;
      goto LAB_00136e96;
    }
    if ((bVar1 == 1) || (bVar1 == 4)) {
      pcVar7 = &(data->state).infilesize;
      goto LAB_00136e93;
    }
    uVar5 = uVar5 & 0xfffcffff;
    *(uint *)&(conn->bits).field_0x4 = uVar5;
    lVar8 = -1;
  }
  else {
    lVar8 = 0;
LAB_00136e96:
    uVar5 = uVar5 & 0xfffdffff;
    *(uint *)&(conn->bits).field_0x4 = uVar5;
    if (lVar8 <= lVar3 && lVar8 != -1) goto LAB_00136f8a;
  }
  uVar4 = (data->state).authproxy.picked;
  if ((((uVar4 == 8) || (uVar4 == 0x20)) || (uVar4 = (data->state).authhost.picked, uVar4 == 0x20))
     || (uVar4 == 8)) {
    if (((lVar8 - lVar3 < 2000) || (conn->http_ntlm_state != NTLMSTATE_NONE)) ||
       (conn->proxy_ntlm_state != NTLMSTATE_NONE)) {
      if ((uVar5 >> 0x10 & 1) != 0) {
        return CURLE_OK;
      }
      if (conn->writesockfd == -1) {
        return CURLE_OK;
      }
      *(uint *)&(conn->bits).field_0x4 = uVar5 | 0x20000;
      Curl_infof(data,"Rewind stream after send");
      return CURLE_OK;
    }
    if ((uVar5 & 0x40) != 0) {
      return CURLE_OK;
    }
    Curl_infof(data,"NTLM send, close instead of sending %ld bytes");
  }
  Curl_conncontrol(conn,2);
  (data->req).size = 0;
LAB_00136f8a:
  if (lVar3 == 0) {
    return CURLE_OK;
  }
  CVar6 = Curl_readrewind(data);
  return CVar6;
}

Assistant:

static CURLcode http_perhapsrewind(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  struct HTTP *http = data->req.p.http;
  curl_off_t bytessent;
  curl_off_t expectsend = -1; /* default is unknown */

  if(!http)
    /* If this is still NULL, we have not reach very far and we can safely
       skip this rewinding stuff */
    return CURLE_OK;

  switch(data->state.httpreq) {
  case HTTPREQ_GET:
  case HTTPREQ_HEAD:
    return CURLE_OK;
  default:
    break;
  }

  bytessent = data->req.writebytecount;

  if(conn->bits.authneg) {
    /* This is a state where we are known to be negotiating and we don't send
       any data then. */
    expectsend = 0;
  }
  else if(!conn->bits.protoconnstart) {
    /* HTTP CONNECT in progress: there is no body */
    expectsend = 0;
  }
  else {
    /* figure out how much data we are expected to send */
    switch(data->state.httpreq) {
    case HTTPREQ_POST:
    case HTTPREQ_PUT:
      if(data->state.infilesize != -1)
        expectsend = data->state.infilesize;
      break;
    case HTTPREQ_POST_FORM:
    case HTTPREQ_POST_MIME:
      expectsend = http->postsize;
      break;
    default:
      break;
    }
  }

  conn->bits.rewindaftersend = FALSE; /* default */

  if((expectsend == -1) || (expectsend > bytessent)) {
#if defined(USE_NTLM)
    /* There is still data left to send */
    if((data->state.authproxy.picked == CURLAUTH_NTLM) ||
       (data->state.authhost.picked == CURLAUTH_NTLM) ||
       (data->state.authproxy.picked == CURLAUTH_NTLM_WB) ||
       (data->state.authhost.picked == CURLAUTH_NTLM_WB)) {
      if(((expectsend - bytessent) < 2000) ||
         (conn->http_ntlm_state != NTLMSTATE_NONE) ||
         (conn->proxy_ntlm_state != NTLMSTATE_NONE)) {
        /* The NTLM-negotiation has started *OR* there is just a little (<2K)
           data left to send, keep on sending. */

        /* rewind data when completely done sending! */
        if(!conn->bits.authneg && (conn->writesockfd != CURL_SOCKET_BAD)) {
          conn->bits.rewindaftersend = TRUE;
          infof(data, "Rewind stream after send");
        }

        return CURLE_OK;
      }

      if(conn->bits.close)
        /* this is already marked to get closed */
        return CURLE_OK;

      infof(data, "NTLM send, close instead of sending %"
            CURL_FORMAT_CURL_OFF_T " bytes",
            (curl_off_t)(expectsend - bytessent));
    }
#endif
#if defined(USE_SPNEGO)
    /* There is still data left to send */
    if((data->state.authproxy.picked == CURLAUTH_NEGOTIATE) ||
       (data->state.authhost.picked == CURLAUTH_NEGOTIATE)) {
      if(((expectsend - bytessent) < 2000) ||
         (conn->http_negotiate_state != GSS_AUTHNONE) ||
         (conn->proxy_negotiate_state != GSS_AUTHNONE)) {
        /* The NEGOTIATE-negotiation has started *OR*
        there is just a little (<2K) data left to send, keep on sending. */

        /* rewind data when completely done sending! */
        if(!conn->bits.authneg && (conn->writesockfd != CURL_SOCKET_BAD)) {
          conn->bits.rewindaftersend = TRUE;
          infof(data, "Rewind stream after send");
        }

        return CURLE_OK;
      }

      if(conn->bits.close)
        /* this is already marked to get closed */
        return CURLE_OK;

      infof(data, "NEGOTIATE send, close instead of sending %"
        CURL_FORMAT_CURL_OFF_T " bytes",
        (curl_off_t)(expectsend - bytessent));
    }
#endif

    /* This is not NEGOTIATE/NTLM or many bytes left to send: close */
    streamclose(conn, "Mid-auth HTTP and much data left to send");
    data->req.size = 0; /* don't download any more than 0 bytes */

    /* There still is data left to send, but this connection is marked for
       closure so we can safely do the rewind right now */
  }

  if(bytessent)
    /* we rewind now at once since if we already sent something */
    return Curl_readrewind(data);

  return CURLE_OK;
}